

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::internal_node<int,_true>_> __thiscall
immutable::rrb_details::execute_concat_plan<int,true,5>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<int,_true>_> *all,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *node_size,uint32_t slen,
          uint32_t shift)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  ref<immutable::rrb_details::internal_node<int,_true>_> *prVar4;
  internal_node<int,_true> *piVar5;
  leaf_node<int,_true> *plVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  ref<immutable::rrb_details::leaf_node<int,_true>_> old_node;
  ref<immutable::rrb_details::leaf_node<int,_true>_> new_node;
  ref<immutable::rrb_details::leaf_node<int,_true>_> old;
  rrb_details local_38 [8];
  
  piVar5 = internal_node_create<int,true>(slen);
  *(internal_node<int,_true> **)this = piVar5;
  if (piVar5 != (internal_node<int,_true> *)0x0) {
    LOCK();
    (piVar5->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
  }
  if (shift == 5) {
    uVar14 = 0;
    uVar9 = 0;
    for (uVar8 = 0; uVar8 != slen; uVar8 = uVar8 + 1) {
      uVar1 = (node_size->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(all);
      old.ptr = (leaf_node<int,_true> *)piVar5->child[uVar9].ptr;
      if ((internal_node<int,_true> *)old.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        (((internal_node<int,_true> *)old.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             (((internal_node<int,_true> *)old.ptr)->_ref_count).super___atomic_base<unsigned_int>.
             _M_i + 1;
        UNLOCK();
      }
      if (uVar14 == 0) {
        plVar6 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->(&old);
        if (uVar1 != plVar6->len) goto LAB_0012166e;
        piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)this);
        ref<immutable::rrb_details::internal_node<int,true>>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,true>> *)(piVar5->child + uVar8),
                   &old);
        uVar9 = uVar9 + 1;
        uVar14 = 0;
      }
      else {
LAB_0012166e:
        new_node.ptr = leaf_node_create<int,true>(uVar1);
        if (new_node.ptr != (leaf_node<int,_true> *)0x0) {
          LOCK();
          ((new_node.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
          UNLOCK();
        }
        uVar12 = 0;
        while( true ) {
          uVar10 = (uint)uVar12;
          uVar7 = uVar1 - uVar10;
          if (uVar1 < uVar10 || uVar7 == 0) break;
          piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(all);
          old_node.ptr = (leaf_node<int,_true> *)piVar5->child[uVar9].ptr;
          if ((internal_node<int,_true> *)old_node.ptr != (internal_node<int,_true> *)0x0) {
            LOCK();
            (((internal_node<int,_true> *)old_node.ptr)->_ref_count).
            super___atomic_base<unsigned_int>._M_i =
                 (((internal_node<int,_true> *)old_node.ptr)->_ref_count).
                 super___atomic_base<unsigned_int>._M_i + 1;
            UNLOCK();
          }
          plVar6 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->(&old_node);
          if (uVar7 < plVar6->len - uVar14) {
            uVar13 = (ulong)uVar7;
            uVar10 = uVar14;
            while( true ) {
              bVar15 = uVar13 == 0;
              uVar13 = uVar13 - 1;
              if (bVar15) break;
              plVar6 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->(&old_node);
              iVar2 = plVar6->child[uVar10];
              plVar6 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->(&new_node);
              plVar6->child[uVar12] = iVar2;
              uVar12 = (ulong)((int)uVar12 + 1);
              uVar10 = uVar10 + 1;
            }
            uVar14 = uVar14 + uVar7;
            uVar7 = uVar1;
          }
          else {
            uVar12 = 0;
            while( true ) {
              plVar6 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->(&old_node);
              uVar11 = plVar6->len;
              plVar6 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->(&old_node);
              if (uVar11 - uVar14 <= uVar12) break;
              iVar2 = plVar6->child[uVar14 + (int)uVar12];
              plVar6 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->(&new_node);
              plVar6->child[uVar10 + (int)uVar12] = iVar2;
              uVar12 = uVar12 + 1;
            }
            uVar7 = (uVar10 - uVar14) + plVar6->len;
            uVar9 = uVar9 + 1;
            uVar14 = 0;
          }
          uVar12 = (ulong)uVar7;
          release<int>(old_node.ptr);
        }
        piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)this);
        ref<immutable::rrb_details::internal_node<int,true>>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,true>> *)(piVar5->child + uVar8),
                   &new_node);
        release<int>(new_node.ptr);
      }
      release<int>(old.ptr);
    }
  }
  else {
    uVar9 = 0;
    uVar12 = 0;
    for (uVar8 = 0; uVar8 != slen; uVar8 = uVar8 + 1) {
      uVar1 = (node_size->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar8];
      piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(all);
      old.ptr = (leaf_node<int,_true> *)piVar5->child[uVar12].ptr;
      if ((internal_node<int,_true> *)old.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        (((internal_node<int,_true> *)old.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             (((internal_node<int,_true> *)old.ptr)->_ref_count).super___atomic_base<unsigned_int>.
             _M_i + 1;
        UNLOCK();
      }
      if (uVar9 == 0) {
        piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&old);
        if (uVar1 != piVar5->len) goto LAB_00121874;
        piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)this);
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                  (piVar5->child + uVar8,
                   (ref<immutable::rrb_details::internal_node<int,_true>_> *)&old);
        uVar12 = (ulong)((int)uVar12 + 1);
        uVar9 = 0;
      }
      else {
LAB_00121874:
        new_node.ptr = (leaf_node<int,_true> *)internal_node_create<int,true>(uVar1);
        if ((internal_node<int,_true> *)new_node.ptr != (internal_node<int,_true> *)0x0) {
          LOCK();
          (((internal_node<int,_true> *)new_node.ptr)->_ref_count).super___atomic_base<unsigned_int>
          ._M_i = 1;
          UNLOCK();
        }
        uVar11 = 0;
        while (uVar14 = uVar1 - uVar11, uVar11 <= uVar1 && uVar14 != 0) {
          piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(all);
          old_node.ptr = (leaf_node<int,_true> *)piVar5->child[uVar12].ptr;
          if ((internal_node<int,_true> *)old_node.ptr != (internal_node<int,_true> *)0x0) {
            LOCK();
            (((internal_node<int,_true> *)old_node.ptr)->_ref_count).
            super___atomic_base<unsigned_int>._M_i =
                 (((internal_node<int,_true> *)old_node.ptr)->_ref_count).
                 super___atomic_base<unsigned_int>._M_i + 1;
            UNLOCK();
          }
          piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                             ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&old_node);
          if (uVar14 < piVar5->len - uVar9) {
            uVar13 = (ulong)uVar14;
            uVar7 = uVar9;
            while (bVar15 = uVar13 != 0, uVar13 = uVar13 - 1, bVar15) {
              piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                                  &old_node);
              prVar4 = piVar5->child;
              piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                                  &new_node);
              ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                        (piVar5->child + uVar11,prVar4 + uVar7);
              uVar11 = uVar11 + 1;
              uVar7 = uVar7 + 1;
            }
            uVar9 = uVar9 + uVar14;
            uVar11 = uVar1;
          }
          else {
            uVar13 = 0;
            while( true ) {
              piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                                  &old_node);
              uVar3 = piVar5->len;
              piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                                  &old_node);
              if (uVar3 - uVar9 <= uVar13) break;
              prVar4 = piVar5->child;
              piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                                 ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                                  &new_node);
              ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                        (piVar5->child + (uVar11 + (int)uVar13),prVar4 + (uVar9 + (int)uVar13));
              uVar13 = uVar13 + 1;
            }
            uVar11 = (uVar11 - uVar9) + piVar5->len;
            uVar12 = (ulong)((int)uVar12 + 1);
            uVar9 = 0;
          }
          ref<immutable::rrb_details::internal_node<int,_true>_>::~ref
                    ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&old_node);
        }
        set_sizes<int,true,5>
                  (local_38,(ref<immutable::rrb_details::internal_node<int,_true>_> *)&new_node,
                   shift - 5);
        ref<immutable::rrb_details::internal_node<int,_true>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<int,_true>_> *)local_38);
        piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->
                           ((ref<immutable::rrb_details::internal_node<int,_true>_> *)this);
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                  (piVar5->child + uVar8,
                   (ref<immutable::rrb_details::internal_node<int,_true>_> *)&new_node);
        ref<immutable::rrb_details::internal_node<int,_true>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&new_node);
      }
      ref<immutable::rrb_details::internal_node<int,_true>_>::~ref
                ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&old);
    }
  }
  return (ref<immutable::rrb_details::internal_node<int,_true>_>)(internal_node<int,_true> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> execute_concat_plan(const ref<internal_node<T, atomic_ref_counting>>& all, const std::vector<uint32_t>& node_size, uint32_t slen, uint32_t shift)
      {
      // the all vector doesn't have sizes set yet.

      ref<internal_node<T, atomic_ref_counting>> new_all = internal_node_create<T, atomic_ref_counting>(slen);
      // Current old node index to copy from
      uint32_t idx = 0;

      // Offset is how long into the current old node we've already copied from
      uint32_t offset = 0;

      if (shift == bits<N>::rrb_bits)
        { // handle leaf nodes here
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<leaf_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            // just pointer copy the node if there is no offset and both have same
            // size
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<leaf_node<T, atomic_ref_counting>> new_node = leaf_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            // cur_size is the current size of the new node
            // (the amount of elements copied into it so far)

            while (cur_size < new_size /*&& idx < all->len*/)
              {
              // the commented out check is verified by create_concat_plan --
              // otherwise the implementation is erroneous!
              ref<leaf_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                // if this node can contain all elements not copied in the old node,
                // copy all of them into this node

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (old_node->len - offset) * sizeof(T));
                for (uint32_t j = 0; j < old_node->len - offset; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                // if this node can't contain all the elements not copied in the old
                // node, copy as many as we can and pass the old node over to the
                // new node after this one.

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (new_size - cur_size) * sizeof(T));
                for (uint32_t j = 0; j < new_size - cur_size; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }

            new_all->child[i] = new_node;
            }
          }
        }
      else
        { // not at lowest non-leaf level
        // this is ALMOST equivalent with the leaf node copying, the only difference
        // is that this is with internal nodes and the fact that they have to create
        // their size tables.

        // As that's the only difference, I won't bother with comments here.
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<internal_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> new_node = internal_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            while (cur_size < new_size)
              {
              ref<internal_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                for (uint32_t k = 0; k < (old_node->len - offset); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                for (uint32_t k = 0; k < (new_size - cur_size); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }
            set_sizes<T, atomic_ref_counting, N>(new_node, shift - bits<N>::rrb_bits); // This is where we set sizes
            new_all->child[i] = new_node;
            }
          }
        }
      return new_all;
      }